

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

termination_code PDHG_Check_Infeasibility(CUPDLPwork *pdhg,int bool_print)

{
  CUPDLPresobj *pCVar1;
  termination_code tVar2;
  int in_ESI;
  CUPDLPwork *in_RDI;
  termination_code t_code;
  CUPDLPresobj *resobj;
  termination_code local_1c;
  
  pCVar1 = in_RDI->resobj;
  local_1c = FEASIBLE;
  tVar2 = PDHG_Check_Primal_Infeasibility(in_RDI,pCVar1->dPrimalInfeasObj,pCVar1->dPrimalInfeasRes);
  if (tVar2 == INFEASIBLE) {
    pCVar1->primalCode = INFEASIBLE;
    pCVar1->termInfeasIterate = LAST_ITERATE;
    local_1c = INFEASIBLE_OR_UNBOUNDED;
  }
  tVar2 = PDHG_Check_Dual_Infeasibility(in_RDI,pCVar1->dDualInfeasObj,pCVar1->dDualInfeasRes);
  if (tVar2 == INFEASIBLE) {
    pCVar1->dualCode = INFEASIBLE;
    pCVar1->termInfeasIterate = LAST_ITERATE;
    local_1c = INFEASIBLE_OR_UNBOUNDED;
  }
  tVar2 = PDHG_Check_Primal_Infeasibility
                    (in_RDI,pCVar1->dPrimalInfeasObjAverage,pCVar1->dPrimalInfeasResAverage);
  if (tVar2 == INFEASIBLE) {
    pCVar1->primalCode = INFEASIBLE;
    pCVar1->termInfeasIterate = AVERAGE_ITERATE;
    local_1c = INFEASIBLE_OR_UNBOUNDED;
  }
  tVar2 = PDHG_Check_Dual_Infeasibility
                    (in_RDI,pCVar1->dDualInfeasObjAverage,pCVar1->dDualInfeasResAverage);
  if (tVar2 == INFEASIBLE) {
    pCVar1->dualCode = INFEASIBLE;
    pCVar1->termInfeasIterate = AVERAGE_ITERATE;
    local_1c = INFEASIBLE_OR_UNBOUNDED;
  }
  if (in_ESI != 0) {
    printf("Last iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n",pCVar1->dPrimalInfeasObj,pCVar1->dPrimalInfeasRes);
    printf("  Dual   obj = %+.4e, res = %+.4e\n",pCVar1->dDualInfeasObj,pCVar1->dDualInfeasRes);
    printf("Average iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n",pCVar1->dPrimalInfeasObjAverage,
           pCVar1->dPrimalInfeasResAverage);
    printf("  Dual   obj = %+.4e, res = %+.4e\n",pCVar1->dDualInfeasObjAverage,
           pCVar1->dDualInfeasResAverage);
  }
  return local_1c;
}

Assistant:

termination_code PDHG_Check_Infeasibility(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPresobj *resobj = pdhg->resobj;
  termination_code t_code = FEASIBLE;

  // current solution

  // primal infeasibility
  if (PDHG_Check_Primal_Infeasibility(pdhg, resobj->dPrimalInfeasObj,
                                      resobj->dPrimalInfeasRes) == INFEASIBLE) {
    resobj->primalCode = INFEASIBLE;
    resobj->termInfeasIterate = LAST_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // dual infeasibility
  if (PDHG_Check_Dual_Infeasibility(pdhg, resobj->dDualInfeasObj,
                                    resobj->dDualInfeasRes) == INFEASIBLE) {
    resobj->dualCode = INFEASIBLE;
    resobj->termInfeasIterate = LAST_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // average solution
  // primal infeasibility
  if (PDHG_Check_Primal_Infeasibility(pdhg, resobj->dPrimalInfeasObjAverage,
                                      resobj->dPrimalInfeasResAverage) ==
      INFEASIBLE) {
    resobj->primalCode = INFEASIBLE;
    resobj->termInfeasIterate = AVERAGE_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  // dual infeasibility
  if (PDHG_Check_Dual_Infeasibility(pdhg, resobj->dDualInfeasObjAverage,
                                    resobj->dDualInfeasResAverage) ==
      INFEASIBLE) {
    resobj->dualCode = INFEASIBLE;
    resobj->termInfeasIterate = AVERAGE_ITERATE;
    t_code = INFEASIBLE_OR_UNBOUNDED;
  }

  if (bool_print) {
    printf("Last iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n", resobj->dPrimalInfeasObj,
           resobj->dPrimalInfeasRes);
    printf("  Dual   obj = %+.4e, res = %+.4e\n", resobj->dDualInfeasObj,
           resobj->dDualInfeasRes);
    printf("Average iter:\n");
    printf("  Primal obj = %+.4e, res = %+.4e\n",
           resobj->dPrimalInfeasObjAverage, resobj->dPrimalInfeasResAverage);
    printf("  Dual   obj = %+.4e, res = %+.4e\n", resobj->dDualInfeasObjAverage,
           resobj->dDualInfeasResAverage);
  }

  return t_code;
}